

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O0

uint32_t FAPOBase_IsInputFormatSupported
                   (FAPOBase *fapo,FAudioWaveFormatEx *pOutputFormat,
                   FAudioWaveFormatEx *pRequestedInputFormat,
                   FAudioWaveFormatEx **ppSupportedInputFormat)

{
  uint16_t uVar1;
  uint32_t local_38;
  uint32_t local_34;
  FAudioWaveFormatEx **ppSupportedInputFormat_local;
  FAudioWaveFormatEx *pRequestedInputFormat_local;
  FAudioWaveFormatEx *pOutputFormat_local;
  FAPOBase *fapo_local;
  uint32_t local_4;
  
  if ((((pRequestedInputFormat->wFormatTag == 3) && (pRequestedInputFormat->nChannels != 0)) &&
      (pRequestedInputFormat->nChannels < 0x41)) &&
     (((999 < pRequestedInputFormat->nSamplesPerSec &&
       (pRequestedInputFormat->nSamplesPerSec < 0x30d41)) &&
      (pRequestedInputFormat->wBitsPerSample == 0x20)))) {
    local_4 = 0;
  }
  else {
    if (ppSupportedInputFormat != (FAudioWaveFormatEx **)0x0) {
      (*ppSupportedInputFormat)->wFormatTag = 3;
      if (pRequestedInputFormat->nChannels < 0x41) {
        if (pRequestedInputFormat->nChannels == 0) {
          uVar1 = 1;
        }
        else {
          uVar1 = pRequestedInputFormat->nChannels;
        }
      }
      else {
        uVar1 = 0x40;
      }
      (*ppSupportedInputFormat)->nChannels = uVar1;
      if (pRequestedInputFormat->nSamplesPerSec < 0x30d41) {
        if (pRequestedInputFormat->nSamplesPerSec < 1000) {
          local_38 = 1000;
        }
        else {
          local_38 = pRequestedInputFormat->nSamplesPerSec;
        }
        local_34 = local_38;
      }
      else {
        local_34 = 200000;
      }
      (*ppSupportedInputFormat)->nSamplesPerSec = local_34;
      (*ppSupportedInputFormat)->wBitsPerSample = 0x20;
    }
    local_4 = 0x88970001;
  }
  return local_4;
}

Assistant:

uint32_t FAPOBase_IsInputFormatSupported(
	FAPOBase *fapo,
	const FAudioWaveFormatEx *pOutputFormat,
	const FAudioWaveFormatEx *pRequestedInputFormat,
	FAudioWaveFormatEx **ppSupportedInputFormat
) {
	if (	pRequestedInputFormat->wFormatTag != FAPOBASE_DEFAULT_FORMAT_TAG ||
		pRequestedInputFormat->nChannels < FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS ||
		pRequestedInputFormat->nChannels > FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS ||
		pRequestedInputFormat->nSamplesPerSec < FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE ||
		pRequestedInputFormat->nSamplesPerSec > FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE ||
		pRequestedInputFormat->wBitsPerSample != FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE	)
	{
		if (ppSupportedInputFormat != NULL)
		{
			(*ppSupportedInputFormat)->wFormatTag =
				FAPOBASE_DEFAULT_FORMAT_TAG;
			(*ppSupportedInputFormat)->nChannels = FAudio_clamp(
				pRequestedInputFormat->nChannels,
				FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS,
				FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS
			);
			(*ppSupportedInputFormat)->nSamplesPerSec = FAudio_clamp(
				pRequestedInputFormat->nSamplesPerSec,
				FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE,
				FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE
			);
			(*ppSupportedInputFormat)->wBitsPerSample =
				FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE;
		}
		return FAPO_E_FORMAT_UNSUPPORTED;
	}
	return 0;
}